

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer>::assemble
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set,_mvm::bytecode_serializer> *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer_____offset_0x10___ *ppuVar2;
  undefined8 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  istringstream iss;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_200;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1d0;
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)line,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&local_1d0,(istream_type *)local_1a0);
  paVar1 = &local_200._M_value.field_2;
  local_200._M_stream = (istream_type *)0x0;
  local_200._M_value._M_string_length = 0;
  local_200._M_value.field_2._M_local_buf[0] = '\0';
  local_200._M_ok = false;
  local_200._M_value._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
             &local_1d0,&local_200,(allocator_type *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_value._M_dataplus._M_p,
                    CONCAT71(local_200._M_value.field_2._M_allocated_capacity._1_7_,
                             local_200._M_value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_value._M_dataplus._M_p != &local_1d0._M_value.field_2) {
    operator_delete(local_1d0._M_value._M_dataplus._M_p,
                    local_1d0._M_value.field_2._M_allocated_capacity + 1);
  }
  if (local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppuVar2 = std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<mvm::assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::assemble(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>>
                        (&traits::instr_set_traits<mvm::test::test_instr_set>::instr_names,
                         &std::bad_optional_access::typeinfo,&local_218);
    if (ppuVar2 != &std::bad_optional_access::typeinfo) {
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      switch((long)(ppuVar2 + -0x306e8) >> 3) {
      case 0:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&mvm::test::test_instr_set::zero,mvm::typestring::type_string<(char)122,(char)101,(char)114,(char)111,(char)0>>>
                  (&local_238,this,'\0',&local_218);
        break;
      case 1:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,true,&mvm::test::test_instr_set::jump,mvm::typestring::type_string<(char)106,(char)117,(char)109,(char)112,(char)0>>>
                  (&local_238,this,'\x01',&local_218);
        break;
      case 2:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,false,&mvm::test::test_instr_set::dup,mvm::typestring::type_string<(char)100,(char)117,(char)112,(char)0>>>
                  (&local_238,this,'\x02',&local_218);
        break;
      case 3:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
                  (&local_238,this,'\x03',&local_218);
        break;
      case 4:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&mvm::test::test_instr_set::randn,mvm::typestring::type_string<(char)114,(char)97,(char)110,(char)100,(char)110,(char)0>>>
                  (&local_238,this,'\x04',&local_218);
        break;
      case 5:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::iterable_consumer<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,mvm::count_from<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>>>,mvm::meta_tie<mvm::meta_value_stack,std::vector<unsigned_int,std::allocator<unsigned_int>>>,false,&mvm::test::test_instr_set::rotln,mvm::typestring::type_string<(char)114,(char)111,(char)116,(char)108,(char)110,(char)0>>>
                  (&local_238,this,'\x05',&local_218);
        break;
      case 6:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_218,
                   (iterator)
                   local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
        assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_instr<mvm::meta_tie<mvm::meta_value_stack,unsigned_int,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,false,&mvm::test::test_instr_set::add,mvm::typestring::type_string<(char)97,(char)100,(char)100,(char)0>>>
                  (&local_238,this,'\x06',&local_218);
        break;
      case 7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 8:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 10:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x10:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x11:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x12:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x13:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x14:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x15:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x16:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x17:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x18:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x19:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x1a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x1b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x1c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x1d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x1e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x1f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x20:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x21:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x22:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x23:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x24:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x25:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x26:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x27:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x28:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x29:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x2a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x2b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x2c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x2d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x2e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x2f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x30:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x31:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x32:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x33:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x34:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x35:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x36:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x37:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x38:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x39:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x3a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x3b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x3c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x3d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x3e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x3f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x40:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x41:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x42:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x43:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x44:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x45:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x46:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x47:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x48:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x49:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x4a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x4b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x4c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x4d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x4e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x4f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x50:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x51:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x52:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x53:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x54:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x55:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x56:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x57:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x58:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x59:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x5a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x5b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x5c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x5d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x5e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x5f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x60:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x61:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x62:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 99:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 100:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x65:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x66:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x67:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x68:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x69:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x6a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x6b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x6c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x6d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x6e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x6f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x70:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x71:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x72:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x73:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x74:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x75:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x76:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x77:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x78:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x79:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x7a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x7b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x7c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x7d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x7e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x7f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x80:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x81:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x82:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x83:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x84:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x85:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x86:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x87:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x88:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x89:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x8a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x8b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x8c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x8d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x8e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x8f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x90:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x91:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x92:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x93:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x94:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x95:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x96:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x97:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x98:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x99:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x9a:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x9b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x9c:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x9d:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x9e:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0x9f:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa0:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa2:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa3:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa4:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa5:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa6:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa8:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xa9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xaa:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xab:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xac:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xad:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xae:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xaf:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb0:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb2:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb3:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb4:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb5:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb6:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb8:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xb9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xba:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xbb:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xbc:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xbd:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xbe:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xbf:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc0:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc2:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc3:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc4:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc5:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc6:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 199:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 200:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xc9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xca:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xcb:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xcc:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xcd:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xce:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xcf:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd0:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd2:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd3:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd4:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd5:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd6:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd8:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xd9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xda:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xdb:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xdc:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xdd:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xde:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xdf:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe0:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe2:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe3:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe4:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe5:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe6:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe8:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xe9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xea:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xeb:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xec:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xed:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xee:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xef:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf0:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf1:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf2:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf3:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf4:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf5:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf6:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf8:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xf9:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xfa:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xfb:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xfc:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xfd:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xfe:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      case 0xff:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] invalid instruction opcode","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 5;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      default:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"[-][mvm] instruction opcode overflow","");
        *puVar3 = &PTR__mexcept_00183098;
        *(undefined2 *)(puVar3 + 1) = 3;
        __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
      }
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start =
           local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_218);
      std::__cxx11::istringstream::~istringstream(local_1a0);
      std::ios_base::~ios_base(local_128);
      return __return_storage_ptr__;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"[-][mvm] invalid instruction name","");
    *puVar3 = &PTR__mexcept_00183098;
    *(undefined2 *)(puVar3 + 1) = 2;
    __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"[-][mvm] no instruction token","");
  *puVar3 = &PTR__mexcept_00183098;
  *(undefined2 *)(puVar3 + 1) = 1;
  __cxa_throw(puVar3,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

std::vector<uint8_t>
assembler<Set, MetaCodeImpl>::assemble(std::string const &line) const {
  std::istringstream iss(line);
  std::vector<std::string> tokens(std::istream_iterator<std::string>{iss},
                                  std::istream_iterator<std::string>());

  if (tokens.empty()) // need at leat an instruction name
  {
    throw mexcept("[-][mvm] no instruction token", status_type::NO_INSTR_NAME);
  }

  auto iname_it = std::find_if(
      std::cbegin(instr_set_traits_type::instr_names),
      std::cend(instr_set_traits_type::instr_names),
      [&](auto const &val) { return std::string(val) == tokens[0]; });

  if (iname_it == std::cend(instr_set_traits_type::instr_names)) {
    throw mexcept("[-][mvm] invalid instruction name",
                  status_type::BAD_INSTR_NAME);
  }

  LOG_INFO("assembler -> assemble instruction " << *iname_it);

  std::vector<uint8_t> bytecode;
  auto instr_index =
      std::distance(std::cbegin(instr_set_traits_type::instr_names), iname_it);

#ifdef FASTI
#define MVM_ASSEMBLE_I(n)                                                      \
  case n: {                                                                    \
    using instr_type = list::at_t<n, instr_set_desc_type>;                     \
    if constexpr (!std::is_same_v<instr_type, nonsuch>) {                      \
      bytecode = assemble_instr<instr_type>(                                   \
          static_cast<uint8_t>(n),                                             \
          (tokens.erase(std::begin(tokens)), tokens));                         \
    } else {                                                                   \
      throw mexcept("[-][mvm] invalid instruction opcode",                     \
                    status_type::INVALID_INSTR_OPCODE);                        \
    }                                                                          \
  } break;
  switch (instr_index) {
    MVM_UNROLL_256(MVM_ASSEMBLE_I)
  default:
    throw mexcept("[-][mvm] instruction opcode overflow",
                  status_type::INSTR_OPCODE_OVERFLOW);
  }
#else
  // visitor version suitable for small instruction sets
  instr_set_visitor<instr_set_desc_type>()(
      instr_index, [&tokens, &bytecode, instr_index, this](auto &&arg) {
        using instr_type = std::decay_t<decltype(arg)>;
        tokens.erase(std::begin(tokens));
        bytecode = this->assemble_instr<instr_type>(
            static_cast<uint8_t>(instr_index), tokens);
      });
#endif

  return bytecode;
}